

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::debugging_internal::ParseExpression(State *state)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  State *in_RDI;
  int arity;
  ParseState copy2;
  ParseState copy;
  ComplexityGuard guard;
  State *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  undefined1 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff51;
  undefined1 in_stack_ffffffffffffff52;
  undefined1 in_stack_ffffffffffffff53;
  undefined1 in_stack_ffffffffffffff54;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  char in_stack_ffffffffffffff57;
  undefined1 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff59;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined1 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5d;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff61;
  undefined1 in_stack_ffffffffffffff62;
  undefined1 in_stack_ffffffffffffff63;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  undefined1 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff69;
  undefined1 in_stack_ffffffffffffff6a;
  undefined1 in_stack_ffffffffffffff6b;
  undefined1 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6d;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff79;
  undefined1 in_stack_ffffffffffffff7a;
  undefined1 in_stack_ffffffffffffff7b;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 in_stack_ffffffffffffff7d;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  undefined1 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff91;
  undefined1 in_stack_ffffffffffffff92;
  undefined1 in_stack_ffffffffffffff93;
  undefined1 in_stack_ffffffffffffff94;
  undefined1 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff99;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  State *in_stack_ffffffffffffffa8;
  ComplexityGuard in_stack_ffffffffffffffe8;
  bool local_1;
  
  anon_unknown_3::ComplexityGuard::ComplexityGuard
            ((ComplexityGuard *)&stack0xffffffffffffffe8,in_RDI);
  bVar6 = anon_unknown_3::ComplexityGuard::IsTooComplex((ComplexityGuard *)&stack0xffffffffffffffe8)
  ;
  if (bVar6) {
    local_1 = false;
  }
  else {
    uVar7 = ParseTemplateParam((State *)CONCAT17(in_stack_ffffffffffffff6f,
                                                 CONCAT16(in_stack_ffffffffffffff6e,
                                                          CONCAT15(in_stack_ffffffffffffff6d,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))));
    if (((bool)uVar7) ||
       (uVar8 = ParseExprPrimary((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                   CONCAT16(in_stack_ffffffffffffff7e,
                                                            CONCAT15(in_stack_ffffffffffffff7d,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff7c,
                                                  CONCAT13(in_stack_ffffffffffffff7b,
                                                           CONCAT12(in_stack_ffffffffffffff7a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78)))))))), (bool)uVar8)) {
      local_1 = true;
    }
    else {
      uVar1 = (in_RDI->parse_state).mangled_idx;
      uVar2 = (in_RDI->parse_state).out_cur_idx;
      uVar3 = *(undefined8 *)&(in_RDI->parse_state).prev_name_idx;
      uVar9 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                  CONCAT16(in_stack_ffffffffffffff5e,
                                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                 CONCAT16(in_stack_ffffffffffffff56,
                                                          CONCAT15(in_stack_ffffffffffffff55,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50))))))));
      if (((bool)uVar9) &&
         ((in_stack_ffffffffffffffa0 =
                OneOrMore((ParseFunc)in_stack_ffffffffffffff28,(State *)0x3d5da3),
          (bool)in_stack_ffffffffffffffa0 &&
          (in_stack_ffffffffffffff9f =
                ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                    CONCAT16(in_stack_ffffffffffffff5e,
                                                             CONCAT15(in_stack_ffffffffffffff5d,
                                                                      CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                  in_stack_ffffffffffffff57), (bool)in_stack_ffffffffffffff9f)))) {
        local_1 = true;
      }
      else {
        (in_RDI->parse_state).mangled_idx = uVar1;
        (in_RDI->parse_state).out_cur_idx = uVar2;
        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
        uVar10 = ParseThreeCharToken((State *)CONCAT17(in_stack_ffffffffffffff6f,
                                                       CONCAT16(in_stack_ffffffffffffff6e,
                                                                CONCAT15(in_stack_ffffffffffffff6d,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
                                     (char *)CONCAT17(in_stack_ffffffffffffff67,
                                                      CONCAT16(in_stack_ffffffffffffff66,
                                                               CONCAT15(in_stack_ffffffffffffff65,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  CONCAT13(in_stack_ffffffffffffff63,
                                                           CONCAT12(in_stack_ffffffffffffff62,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60))))))));
        if ((((bool)uVar10) ||
            (in_stack_ffffffffffffff9d =
                  ParseThreeCharToken((State *)CONCAT17(in_stack_ffffffffffffff6f,
                                                        CONCAT16(in_stack_ffffffffffffff6e,
                                                                 CONCAT15(in_stack_ffffffffffffff6d,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))),
                                      (char *)CONCAT17(in_stack_ffffffffffffff67,
                                                       CONCAT16(in_stack_ffffffffffffff66,
                                                                CONCAT15(in_stack_ffffffffffffff65,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff64,
                                                  CONCAT13(in_stack_ffffffffffffff63,
                                                           CONCAT12(in_stack_ffffffffffffff62,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff61,
                                                  in_stack_ffffffffffffff60)))))))),
            (bool)in_stack_ffffffffffffff9d)) &&
           (in_stack_ffffffffffffff9c = ParseExpression(in_stack_ffffffffffffffe8.state_),
           (bool)in_stack_ffffffffffffff9c)) {
          local_1 = true;
        }
        else {
          (in_RDI->parse_state).mangled_idx = uVar1;
          (in_RDI->parse_state).out_cur_idx = uVar2;
          *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
          uVar11 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                       CONCAT16(in_stack_ffffffffffffff5e,
                                                                CONCAT15(in_stack_ffffffffffffff5d,
                                                                         CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                     (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                      CONCAT16(in_stack_ffffffffffffff56,
                                                               CONCAT15(in_stack_ffffffffffffff55,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50))))))));
          if ((((bool)uVar11) &&
              (in_stack_ffffffffffffff9a =
                    ParseSimpleId((State *)CONCAT17(in_stack_ffffffffffffff37,
                                                    in_stack_ffffffffffffff30)),
              (bool)in_stack_ffffffffffffff9a)) &&
             ((in_stack_ffffffffffffff99 =
                    ZeroOrMore((ParseFunc)
                               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                               in_stack_ffffffffffffff28), (bool)in_stack_ffffffffffffff99 &&
              (in_stack_ffffffffffffff98 =
                    ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                        CONCAT16(in_stack_ffffffffffffff5e,
                                                                 CONCAT15(in_stack_ffffffffffffff5d,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                      in_stack_ffffffffffffff57), (bool)in_stack_ffffffffffffff98)))
             ) {
            local_1 = true;
          }
          else {
            (in_RDI->parse_state).mangled_idx = uVar1;
            (in_RDI->parse_state).out_cur_idx = uVar2;
            *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
            uVar12 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                         CONCAT16(in_stack_ffffffffffffff5e,
                                                                  CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                       (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                        CONCAT16(in_stack_ffffffffffffff56,
                                                                 CONCAT15(in_stack_ffffffffffffff55,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50))))))));
            if ((((bool)uVar12) &&
                (uVar13 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                      CONCAT16(in_stack_ffffffffffffff7e,
                                                               CONCAT15(in_stack_ffffffffffffff7d,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffff7c,
                                                  CONCAT13(in_stack_ffffffffffffff7b,
                                                           CONCAT12(in_stack_ffffffffffffff7a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78)))))))), (bool)uVar13))
               && (bVar6 = ParseExpression(in_stack_ffffffffffffffe8.state_), bVar6)) {
              bVar6 = ParseNumber((State *)CONCAT17(in_stack_ffffffffffffff9f,
                                                    CONCAT16(uVar10,CONCAT15(
                                                  in_stack_ffffffffffffff9d,
                                                  CONCAT14(in_stack_ffffffffffffff9c,
                                                           CONCAT13(uVar11,CONCAT12(
                                                  in_stack_ffffffffffffff9a,
                                                  CONCAT11(in_stack_ffffffffffffff99,
                                                           in_stack_ffffffffffffff98))))))),
                                  (int *)CONCAT17(uVar12,CONCAT16(uVar13,CONCAT15(bVar6,CONCAT14(
                                                  in_stack_ffffffffffffff94,
                                                  CONCAT13(in_stack_ffffffffffffff93,
                                                           CONCAT12(in_stack_ffffffffffffff92,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff91,
                                                  in_stack_ffffffffffffff90))))))));
              bVar6 = Optional(bVar6);
              if ((bVar6) &&
                 (bVar6 = ZeroOrMore((ParseFunc)
                                     CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                                     in_stack_ffffffffffffff28), bVar6)) {
                bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                            CONCAT16(in_stack_ffffffffffffff5e,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                          in_stack_ffffffffffffff57);
                bVar6 = Optional(bVar6);
                if ((bVar6) &&
                   (bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                CONCAT16(in_stack_ffffffffffffff5e,
                                                                         CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                              in_stack_ffffffffffffff57), bVar6)) {
                  local_1 = true;
                  goto LAB_003d70af;
                }
              }
            }
            (in_RDI->parse_state).mangled_idx = uVar1;
            (in_RDI->parse_state).out_cur_idx = uVar2;
            *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
            bVar6 = ParseFunctionParam((State *)CONCAT17(in_stack_ffffffffffffff6f,
                                                         CONCAT16(in_stack_ffffffffffffff6e,
                                                                  CONCAT15(in_stack_ffffffffffffff6d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(in_stack_ffffffffffffff6a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff69,
                                                  in_stack_ffffffffffffff68))))))));
            if (bVar6) {
              local_1 = true;
            }
            else {
              (in_RDI->parse_state).mangled_idx = uVar1;
              (in_RDI->parse_state).out_cur_idx = uVar2;
              *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
              bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                          CONCAT16(in_stack_ffffffffffffff5e,
                                                                   CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                        (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                         CONCAT16(in_stack_ffffffffffffff56,
                                                                  CONCAT15(in_stack_ffffffffffffff55
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff54,
                                                  CONCAT13(in_stack_ffffffffffffff53,
                                                           CONCAT12(in_stack_ffffffffffffff52,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff51,
                                                  in_stack_ffffffffffffff50))))))));
              if ((((bVar6) &&
                   (bVar6 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                        CONCAT16(in_stack_ffffffffffffff7e,
                                                                 CONCAT15(in_stack_ffffffffffffff7d,
                                                                          CONCAT14(
                                                  in_stack_ffffffffffffff7c,
                                                  CONCAT13(in_stack_ffffffffffffff7b,
                                                           CONCAT12(in_stack_ffffffffffffff7a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff79,
                                                  in_stack_ffffffffffffff78)))))))), bVar6)) &&
                  (bVar6 = ZeroOrMore((ParseFunc)
                                      CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                                      in_stack_ffffffffffffff28), bVar6)) &&
                 (bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                              CONCAT16(in_stack_ffffffffffffff5e,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                            in_stack_ffffffffffffff57), bVar6)) {
                local_1 = true;
              }
              else {
                (in_RDI->parse_state).mangled_idx = uVar1;
                (in_RDI->parse_state).out_cur_idx = uVar2;
                *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                            CONCAT16(in_stack_ffffffffffffff5e,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                          (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                           CONCAT16(in_stack_ffffffffffffff56,
                                                                    CONCAT15(
                                                  in_stack_ffffffffffffff55,
                                                  CONCAT14(in_stack_ffffffffffffff54,
                                                           CONCAT13(in_stack_ffffffffffffff53,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  CONCAT11(in_stack_ffffffffffffff51,
                                                           in_stack_ffffffffffffff50))))))));
                if (((bVar6) &&
                    (bVar6 = ZeroOrMore((ParseFunc)
                                        CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30
                                                ),in_stack_ffffffffffffff28), bVar6)) &&
                   (bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                CONCAT16(in_stack_ffffffffffffff5e,
                                                                         CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                              in_stack_ffffffffffffff57), bVar6)) {
                  local_1 = true;
                }
                else {
                  (in_RDI->parse_state).mangled_idx = uVar1;
                  (in_RDI->parse_state).out_cur_idx = uVar2;
                  *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                  bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                              CONCAT16(in_stack_ffffffffffffff5e,
                                                                       CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                            (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                             CONCAT16(in_stack_ffffffffffffff56,
                                                                      CONCAT15(
                                                  in_stack_ffffffffffffff55,
                                                  CONCAT14(in_stack_ffffffffffffff54,
                                                           CONCAT13(in_stack_ffffffffffffff53,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  CONCAT11(in_stack_ffffffffffffff51,
                                                           in_stack_ffffffffffffff50))))))));
                  bVar6 = Optional(bVar6);
                  if (((((bVar6) &&
                        ((bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                      CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  ), bVar6 ||
                         (bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                      CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  ), bVar6)))) &&
                       (bVar6 = ZeroOrMore((ParseFunc)
                                           CONCAT17(in_stack_ffffffffffffff37,
                                                    in_stack_ffffffffffffff30),
                                           in_stack_ffffffffffffff28), bVar6)) &&
                      ((bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,in_stack_ffffffffffffff57), bVar6 &&
                       (bVar6 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                            CONCAT16(in_stack_ffffffffffffff7e,
                                                                     CONCAT15(
                                                  in_stack_ffffffffffffff7d,
                                                  CONCAT14(in_stack_ffffffffffffff7c,
                                                           CONCAT13(in_stack_ffffffffffffff7b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff7a,
                                                  CONCAT11(in_stack_ffffffffffffff79,
                                                           in_stack_ffffffffffffff78)))))))), bVar6)
                       ))) && ((in_stack_ffffffffffffff7f =
                                     ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                         CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,in_stack_ffffffffffffff57),
                               (bool)in_stack_ffffffffffffff7f ||
                               (in_stack_ffffffffffffff7e =
                                     ParseInitializer((State *)CONCAT17(in_stack_ffffffffffffff6f,
                                                                        CONCAT16(
                                                  in_stack_ffffffffffffff6e,
                                                  CONCAT15(in_stack_ffffffffffffff6d,
                                                           CONCAT14(in_stack_ffffffffffffff6c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff6b,
                                                  CONCAT12(in_stack_ffffffffffffff6a,
                                                           CONCAT11(in_stack_ffffffffffffff69,
                                                                    in_stack_ffffffffffffff68)))))))
                                                  ), (bool)in_stack_ffffffffffffff7e)))) {
                    local_1 = true;
                  }
                  else {
                    (in_RDI->parse_state).mangled_idx = uVar1;
                    (in_RDI->parse_state).out_cur_idx = uVar2;
                    *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                    uVar10 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                 CONCAT16(in_stack_ffffffffffffff5e,
                                                                          CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(in_stack_ffffffffffffff5b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,
                                                           in_stack_ffffffffffffff58))))))),
                                               (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                CONCAT16(in_stack_ffffffffffffff56,
                                                                         CONCAT15(
                                                  in_stack_ffffffffffffff55,
                                                  CONCAT14(in_stack_ffffffffffffff54,
                                                           CONCAT13(in_stack_ffffffffffffff53,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff52,
                                                  CONCAT11(in_stack_ffffffffffffff51,
                                                           in_stack_ffffffffffffff50))))))));
                    uVar11 = Optional((bool)uVar10);
                    if (((bool)uVar11) &&
                       (((in_stack_ffffffffffffff7b =
                               ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                 ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                ), (bool)in_stack_ffffffffffffff7b ||
                         (in_stack_ffffffffffffff7a =
                               ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                 ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                ), (bool)in_stack_ffffffffffffff7a)) &&
                        (in_stack_ffffffffffffff79 =
                              ParseExpression(in_stack_ffffffffffffffe8.state_),
                        (bool)in_stack_ffffffffffffff79)))) {
                      local_1 = true;
                    }
                    else {
                      (in_RDI->parse_state).mangled_idx = uVar1;
                      (in_RDI->parse_state).out_cur_idx = uVar2;
                      *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                      uVar12 = ParseCharClass((State *)CONCAT17(in_stack_ffffffffffffff6f,
                                                                CONCAT16(in_stack_ffffffffffffff6e,
                                                                         CONCAT15(
                                                  in_stack_ffffffffffffff6d,
                                                  CONCAT14(in_stack_ffffffffffffff6c,
                                                           CONCAT13(in_stack_ffffffffffffff6b,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff6a,
                                                  CONCAT11(in_stack_ffffffffffffff69,
                                                           in_stack_ffffffffffffff68))))))),
                                              (char *)CONCAT17(in_stack_ffffffffffffff67,
                                                               CONCAT16(in_stack_ffffffffffffff66,
                                                                        CONCAT15(
                                                  in_stack_ffffffffffffff65,
                                                  CONCAT14(in_stack_ffffffffffffff64,
                                                           CONCAT13(in_stack_ffffffffffffff63,
                                                                    CONCAT12(
                                                  in_stack_ffffffffffffff62,
                                                  CONCAT11(in_stack_ffffffffffffff61,
                                                           in_stack_ffffffffffffff60))))))));
                      if ((((bool)uVar12) &&
                          (bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                       CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,in_stack_ffffffffffffff57), bVar6)) &&
                         ((bVar6 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                               CONCAT16(in_stack_ffffffffffffff7e,
                                                                        CONCAT15(uVar10,CONCAT14(
                                                  uVar11,CONCAT13(in_stack_ffffffffffffff7b,
                                                                  CONCAT12(in_stack_ffffffffffffff7a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff79,uVar12)))))))), bVar6 &&
                          (bVar6 = ParseExpression(in_stack_ffffffffffffffe8.state_), bVar6)))) {
                        local_1 = true;
                      }
                      else {
                        (in_RDI->parse_state).mangled_idx = uVar1;
                        (in_RDI->parse_state).out_cur_idx = uVar2;
                        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                        bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                 );
                        if (bVar6) {
                          bVar6 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                              CONCAT16(in_stack_ffffffffffffff7e,
                                                                       CONCAT15(uVar10,CONCAT14(
                                                  uVar11,CONCAT13(in_stack_ffffffffffffff7b,
                                                                  CONCAT12(in_stack_ffffffffffffff7a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff79,uVar12))))))));
                          if (bVar6) {
                            in_stack_ffffffffffffffa8 = *(State **)&in_RDI->parse_state;
                            iVar4 = (in_RDI->parse_state).prev_name_idx;
                            uVar5 = *(undefined4 *)&(in_RDI->parse_state).field_0xc;
                            bVar6 = ParseOneCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                        CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,in_stack_ffffffffffffff57);
                            if (((bVar6) &&
                                (bVar6 = ZeroOrMore((ParseFunc)
                                                    CONCAT17(in_stack_ffffffffffffff37,
                                                             in_stack_ffffffffffffff30),
                                                    in_stack_ffffffffffffff28), bVar6)) &&
                               (bVar6 = ParseOneCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(in_stack_ffffffffffffff5e,
                                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  in_stack_ffffffffffffff57), bVar6)) {
                              local_1 = true;
                              goto LAB_003d70af;
                            }
                            *(State **)&in_RDI->parse_state = in_stack_ffffffffffffffa8;
                            (in_RDI->parse_state).prev_name_idx = iVar4;
                            *(undefined4 *)&(in_RDI->parse_state).field_0xc = uVar5;
                            in_stack_ffffffffffffff6f =
                                 ParseExpression(in_stack_ffffffffffffffe8.state_);
                            if ((bool)in_stack_ffffffffffffff6f) {
                              local_1 = true;
                              goto LAB_003d70af;
                            }
                          }
                        }
                        else {
                          in_stack_ffffffffffffffa4 = -1;
                          in_stack_ffffffffffffff6e =
                               ParseOperatorName(in_stack_ffffffffffffffa8,
                                                 (int *)CONCAT44(0xffffffff,
                                                                 CONCAT13(uVar7,CONCAT12(uVar8,
                                                  CONCAT11(uVar9,in_stack_ffffffffffffffa0)))));
                          if (((((bool)in_stack_ffffffffffffff6e) && (0 < in_stack_ffffffffffffffa4)
                               ) && (((in_stack_ffffffffffffffa4 < 3 ||
                                      (in_stack_ffffffffffffff6d =
                                            ParseExpression(in_stack_ffffffffffffffe8.state_),
                                      (bool)in_stack_ffffffffffffff6d)) &&
                                     ((in_stack_ffffffffffffffa4 < 2 ||
                                      (in_stack_ffffffffffffff6c =
                                            ParseExpression(in_stack_ffffffffffffffe8.state_),
                                      (bool)in_stack_ffffffffffffff6c)))))) &&
                             ((in_stack_ffffffffffffffa4 < 1 ||
                              (in_stack_ffffffffffffff6b =
                                    ParseExpression(in_stack_ffffffffffffffe8.state_),
                              (bool)in_stack_ffffffffffffff6b)))) {
                            local_1 = true;
                            goto LAB_003d70af;
                          }
                        }
                        (in_RDI->parse_state).mangled_idx = uVar1;
                        (in_RDI->parse_state).out_cur_idx = uVar2;
                        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                        uVar13 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                     CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                        if (((bool)uVar13) &&
                           (in_stack_ffffffffffffff69 =
                                 ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                             CONCAT16(in_stack_ffffffffffffff7e,
                                                                      CONCAT15(uVar10,CONCAT14(
                                                  uVar11,CONCAT13(in_stack_ffffffffffffff7b,
                                                                  CONCAT12(in_stack_ffffffffffffff7a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff79,uVar12)))))))),
                           (bool)in_stack_ffffffffffffff69)) {
                          local_1 = true;
                        }
                        else {
                          (in_RDI->parse_state).mangled_idx = uVar1;
                          (in_RDI->parse_state).out_cur_idx = uVar2;
                          *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                          uVar14 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                       CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                          if (((bool)uVar14) &&
                             (bVar6 = ParseExpression(in_stack_ffffffffffffffe8.state_), bVar6)) {
                            local_1 = true;
                          }
                          else {
                            (in_RDI->parse_state).mangled_idx = uVar1;
                            (in_RDI->parse_state).out_cur_idx = uVar2;
                            *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                            bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                        CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                            if ((bVar6) &&
                               (bVar6 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff7e,
                                                  CONCAT15(uVar10,CONCAT14(uVar11,CONCAT13(
                                                  in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,uVar12
                                                                   )))))))), bVar6)) {
                              local_1 = true;
                            }
                            else {
                              (in_RDI->parse_state).mangled_idx = uVar1;
                              (in_RDI->parse_state).out_cur_idx = uVar2;
                              *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                              bVar6 = ParseTwoCharToken((State *)CONCAT17(in_stack_ffffffffffffff5f,
                                                                          CONCAT16(
                                                  in_stack_ffffffffffffff5e,
                                                  CONCAT15(in_stack_ffffffffffffff5d,
                                                           CONCAT14(in_stack_ffffffffffffff5c,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff5b,
                                                  CONCAT12(in_stack_ffffffffffffff5a,
                                                           CONCAT11(in_stack_ffffffffffffff59,
                                                                    in_stack_ffffffffffffff58)))))))
                                                  ,(char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                    CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                              if ((bVar6) &&
                                 (bVar6 = ParseType((State *)CONCAT17(in_stack_ffffffffffffff7f,
                                                                      CONCAT16(
                                                  in_stack_ffffffffffffff7e,
                                                  CONCAT15(uVar10,CONCAT14(uVar11,CONCAT13(
                                                  in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,uVar12
                                                                   )))))))), bVar6)) {
                                local_1 = true;
                              }
                              else {
                                (in_RDI->parse_state).mangled_idx = uVar1;
                                (in_RDI->parse_state).out_cur_idx = uVar2;
                                *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                                bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(in_stack_ffffffffffffff5e,
                                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                if ((bVar6) &&
                                   (bVar6 = ParseExpression(in_stack_ffffffffffffffe8.state_), bVar6
                                   )) {
                                  local_1 = true;
                                }
                                else {
                                  (in_RDI->parse_state).mangled_idx = uVar1;
                                  (in_RDI->parse_state).out_cur_idx = uVar2;
                                  *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                                  bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(in_stack_ffffffffffffff5e,
                                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                  if ((bVar6) &&
                                     (in_stack_ffffffffffffff5f =
                                           ParseExpression(in_stack_ffffffffffffffe8.state_),
                                     (bool)in_stack_ffffffffffffff5f)) {
                                    local_1 = true;
                                  }
                                  else {
                                    (in_RDI->parse_state).mangled_idx = uVar1;
                                    (in_RDI->parse_state).out_cur_idx = uVar2;
                                    *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                                    uVar15 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(in_stack_ffffffffffffff5e,
                                                           CONCAT15(in_stack_ffffffffffffff5d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                    if (((bool)uVar15) &&
                                       ((in_stack_ffffffffffffff5d =
                                              ParseFunctionParam((State *)CONCAT17(
                                                  in_stack_ffffffffffffff6f,
                                                  CONCAT16(in_stack_ffffffffffffff6e,
                                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(uVar13,CONCAT11(
                                                  in_stack_ffffffffffffff69,uVar14)))))))),
                                        (bool)in_stack_ffffffffffffff5d ||
                                        (in_stack_ffffffffffffff5c =
                                              ParseTemplateParam((State *)CONCAT17(
                                                  in_stack_ffffffffffffff6f,
                                                  CONCAT16(in_stack_ffffffffffffff6e,
                                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(uVar13,CONCAT11(
                                                  in_stack_ffffffffffffff69,uVar14)))))))),
                                        (bool)in_stack_ffffffffffffff5c)))) {
                                      local_1 = true;
                                    }
                                    else {
                                      (in_RDI->parse_state).mangled_idx = uVar1;
                                      (in_RDI->parse_state).out_cur_idx = uVar2;
                                      *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                                      uVar16 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(in_stack_ffffffffffffff5b,
                                                           CONCAT12(in_stack_ffffffffffffff5a,
                                                                    CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                      if ((((bool)uVar16) &&
                                          (in_stack_ffffffffffffff5a =
                                                ZeroOrMore((ParseFunc)
                                                           CONCAT17(in_stack_ffffffffffffff37,
                                                                    in_stack_ffffffffffffff30),
                                                           in_stack_ffffffffffffff28),
                                          (bool)in_stack_ffffffffffffff5a)) &&
                                         (in_stack_ffffffffffffff59 =
                                               ParseOneCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  in_stack_ffffffffffffff57),
                                         (bool)in_stack_ffffffffffffff59)) {
                                        local_1 = true;
                                      }
                                      else {
                                        (in_RDI->parse_state).mangled_idx = uVar1;
                                        (in_RDI->parse_state).out_cur_idx = uVar2;
                                        *(undefined8 *)&(in_RDI->parse_state).prev_name_idx = uVar3;
                                        uVar17 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,
                                                  in_stack_ffffffffffffff58))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                        if ((((bool)uVar17) ||
                                            (in_stack_ffffffffffffff57 =
                                                  ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  ), (bool)in_stack_ffffffffffffff57)) &&
                                           ((in_stack_ffffffffffffff56 =
                                                  ParseOperatorName(in_stack_ffffffffffffffa8,
                                                                    (int *)CONCAT44(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(uVar7,CONCAT12(uVar8,CONCAT11(uVar9,
                                                  in_stack_ffffffffffffffa0))))),
                                            (bool)in_stack_ffffffffffffff56 &&
                                            (in_stack_ffffffffffffff55 =
                                                  ParseExpression(in_stack_ffffffffffffffe8.state_),
                                            (bool)in_stack_ffffffffffffff55)))) {
                                          local_1 = true;
                                        }
                                        else {
                                          (in_RDI->parse_state).mangled_idx = uVar1;
                                          (in_RDI->parse_state).out_cur_idx = uVar2;
                                          *(undefined8 *)&(in_RDI->parse_state).prev_name_idx =
                                               uVar3;
                                          uVar18 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(in_stack_ffffffffffffff54,
                                                                    CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                          if ((((bool)uVar18) ||
                                              (in_stack_ffffffffffffff53 =
                                                    ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  ), (bool)in_stack_ffffffffffffff53)) &&
                                             ((in_stack_ffffffffffffff52 =
                                                    ParseOperatorName(in_stack_ffffffffffffffa8,
                                                                      (int *)CONCAT44(
                                                  in_stack_ffffffffffffffa4,
                                                  CONCAT13(uVar7,CONCAT12(uVar8,CONCAT11(uVar9,
                                                  in_stack_ffffffffffffffa0))))),
                                              (bool)in_stack_ffffffffffffff52 &&
                                              ((in_stack_ffffffffffffff51 =
                                                     ParseExpression(in_stack_ffffffffffffffe8.
                                                                     state_),
                                               (bool)in_stack_ffffffffffffff51 &&
                                               (in_stack_ffffffffffffff50 =
                                                     ParseExpression(in_stack_ffffffffffffffe8.
                                                                     state_),
                                               (bool)in_stack_ffffffffffffff50)))))) {
                                            local_1 = true;
                                          }
                                          else {
                                            (in_RDI->parse_state).mangled_idx = uVar1;
                                            (in_RDI->parse_state).out_cur_idx = uVar2;
                                            *(undefined8 *)&(in_RDI->parse_state).prev_name_idx =
                                                 uVar3;
                                            bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                            if ((bVar6) &&
                                               (bVar6 = ParseExpression(in_stack_ffffffffffffffe8.
                                                                        state_), bVar6)) {
                                              local_1 = true;
                                            }
                                            else {
                                              (in_RDI->parse_state).mangled_idx = uVar1;
                                              (in_RDI->parse_state).out_cur_idx = uVar2;
                                              *(undefined8 *)&(in_RDI->parse_state).prev_name_idx =
                                                   uVar3;
                                              bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                              if (bVar6) {
                                                local_1 = true;
                                              }
                                              else {
                                                bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                                if ((((bVar6) ||
                                                     (bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  ), bVar6)) &&
                                                  (bVar6 = ParseExpression(in_stack_ffffffffffffffe8
                                                                           .state_), bVar6)) &&
                                                  (bVar6 = ParseUnresolvedName((State *)CONCAT17(
                                                  in_stack_ffffffffffffff7f,
                                                  CONCAT16(in_stack_ffffffffffffff7e,
                                                           CONCAT15(uVar10,CONCAT14(uVar11,CONCAT13(
                                                  in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,uVar12
                                                                   )))))))), bVar6)) {
                                                  local_1 = true;
                                                }
                                                else {
                                                  (in_RDI->parse_state).mangled_idx = uVar1;
                                                  (in_RDI->parse_state).out_cur_idx = uVar2;
                                                  *(undefined8 *)
                                                   &(in_RDI->parse_state).prev_name_idx = uVar3;
                                                  bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                                  if (((bVar6) &&
                                                      (bVar6 = ParseExpression(
                                                  in_stack_ffffffffffffffe8.state_), bVar6)) &&
                                                  (bVar6 = ParseExpression(in_stack_ffffffffffffffe8
                                                                           .state_), bVar6)) {
                                                    local_1 = true;
                                                  }
                                                  else {
                                                    (in_RDI->parse_state).mangled_idx = uVar1;
                                                    (in_RDI->parse_state).out_cur_idx = uVar2;
                                                    *(undefined8 *)
                                                     &(in_RDI->parse_state).prev_name_idx = uVar3;
                                                    bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                                  if ((bVar6) &&
                                                     (bVar6 = ParseExpression(
                                                  in_stack_ffffffffffffffe8.state_), bVar6)) {
                                                    local_1 = true;
                                                  }
                                                  else {
                                                    (in_RDI->parse_state).mangled_idx = uVar1;
                                                    (in_RDI->parse_state).out_cur_idx = uVar2;
                                                    *(undefined8 *)
                                                     &(in_RDI->parse_state).prev_name_idx = uVar3;
                                                    bVar6 = ParseOneCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  in_stack_ffffffffffffff57);
                                                  if ((((bVar6) &&
                                                       (bVar6 = ParseSourceName((State *)CONCAT17(
                                                  in_stack_ffffffffffffff6f,
                                                  CONCAT16(in_stack_ffffffffffffff6e,
                                                           CONCAT15(in_stack_ffffffffffffff6d,
                                                                    CONCAT14(
                                                  in_stack_ffffffffffffff6c,
                                                  CONCAT13(in_stack_ffffffffffffff6b,
                                                           CONCAT12(uVar13,CONCAT11(
                                                  in_stack_ffffffffffffff69,uVar14)))))))), bVar6))
                                                  && (bVar6 = ZeroOrMore((ParseFunc)
                                                                         CONCAT17(
                                                  in_stack_ffffffffffffff37,
                                                  in_stack_ffffffffffffff30),
                                                  in_stack_ffffffffffffff28), bVar6)) &&
                                                  (bVar6 = ParseOneCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  in_stack_ffffffffffffff57), bVar6)) {
                                                    local_1 = true;
                                                  }
                                                  else {
                                                    (in_RDI->parse_state).mangled_idx = uVar1;
                                                    (in_RDI->parse_state).out_cur_idx = uVar2;
                                                    *(undefined8 *)
                                                     &(in_RDI->parse_state).prev_name_idx = uVar3;
                                                    bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                                  if (((bVar6) &&
                                                      (bVar6 = OneOrMore((ParseFunc)
                                                                         in_stack_ffffffffffffff28,
                                                                         (State *)0x3d6f51), bVar6))
                                                     && (bVar6 = ParseOneCharToken((State *)CONCAT17
                                                  (in_stack_ffffffffffffff5f,
                                                   CONCAT16(uVar15,CONCAT15(
                                                  in_stack_ffffffffffffff5d,
                                                  CONCAT14(in_stack_ffffffffffffff5c,
                                                           CONCAT13(uVar16,CONCAT12(
                                                  in_stack_ffffffffffffff5a,
                                                  CONCAT11(in_stack_ffffffffffffff59,uVar17))))))),
                                                  in_stack_ffffffffffffff57), bVar6)) {
                                                    local_1 = true;
                                                  }
                                                  else {
                                                    (in_RDI->parse_state).mangled_idx = uVar1;
                                                    (in_RDI->parse_state).out_cur_idx = uVar2;
                                                    *(undefined8 *)
                                                     &(in_RDI->parse_state).prev_name_idx = uVar3;
                                                    bVar6 = ParseTwoCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  (char *)CONCAT17(in_stack_ffffffffffffff57,
                                                                   CONCAT16(
                                                  in_stack_ffffffffffffff56,
                                                  CONCAT15(in_stack_ffffffffffffff55,
                                                           CONCAT14(uVar18,CONCAT13(
                                                  in_stack_ffffffffffffff53,
                                                  CONCAT12(in_stack_ffffffffffffff52,
                                                           CONCAT11(in_stack_ffffffffffffff51,
                                                                    in_stack_ffffffffffffff50)))))))
                                                  );
                                                  if (((bVar6) &&
                                                      (bVar6 = ParseBareFunctionType
                                                                         ((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17)))))))), bVar6))
                                                  && ((bVar6 = ParseOneCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  in_stack_ffffffffffffff57), bVar6 &&
                                                  ((bVar6 = OneOrMore((ParseFunc)
                                                                      in_stack_ffffffffffffff28,
                                                                      (State *)0x3d7029), bVar6 &&
                                                   (bVar6 = ParseOneCharToken((State *)CONCAT17(
                                                  in_stack_ffffffffffffff5f,
                                                  CONCAT16(uVar15,CONCAT15(in_stack_ffffffffffffff5d
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff5c,
                                                  CONCAT13(uVar16,CONCAT12(in_stack_ffffffffffffff5a
                                                                           ,CONCAT11(
                                                  in_stack_ffffffffffffff59,uVar17))))))),
                                                  in_stack_ffffffffffffff57), bVar6)))))) {
                                                    local_1 = true;
                                                  }
                                                  else {
                                                    (in_RDI->parse_state).mangled_idx = uVar1;
                                                    (in_RDI->parse_state).out_cur_idx = uVar2;
                                                    *(undefined8 *)
                                                     &(in_RDI->parse_state).prev_name_idx = uVar3;
                                                    local_1 = ParseUnresolvedName((State *)CONCAT17(
                                                  in_stack_ffffffffffffff7f,
                                                  CONCAT16(in_stack_ffffffffffffff7e,
                                                           CONCAT15(uVar10,CONCAT14(uVar11,CONCAT13(
                                                  in_stack_ffffffffffffff7b,
                                                  CONCAT12(in_stack_ffffffffffffff7a,
                                                           CONCAT11(in_stack_ffffffffffffff79,uVar12
                                                                   ))))))));
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_003d70af:
  anon_unknown_3::ComplexityGuard::~ComplexityGuard((ComplexityGuard *)&stack0xffffffffffffffe8);
  return local_1;
}

Assistant:

static bool ParseExpression(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  if (ParseTemplateParam(state) || ParseExprPrimary(state)) {
    return true;
  }

  ParseState copy = state->parse_state;

  // Object/function call expression.
  if (ParseTwoCharToken(state, "cl") && OneOrMore(ParseExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Preincrement and predecrement.  Postincrement and postdecrement are handled
  // by the operator-name logic later on.
  if ((ParseThreeCharToken(state, "pp_") ||
       ParseThreeCharToken(state, "mm_")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Clang-specific "cp <simple-id> <expression>* E"
  //   https://clang.llvm.org/doxygen/ItaniumMangle_8cpp_source.html#l04338
  if (ParseTwoCharToken(state, "cp") && ParseSimpleId(state) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= so <type> <expression> [<number>] <union-selector>* [p] E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/47
  if (ParseTwoCharToken(state, "so") && ParseType(state) &&
      ParseExpression(state) && Optional(ParseNumber(state, nullptr)) &&
      ZeroOrMore(ParseUnionSelector, state) &&
      Optional(ParseOneCharToken(state, 'p')) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= <function-param>
  if (ParseFunctionParam(state)) return true;
  state->parse_state = copy;

  // <expression> ::= tl <type> <braced-expression>* E
  if (ParseTwoCharToken(state, "tl") && ParseType(state) &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= il <braced-expression>* E
  if (ParseTwoCharToken(state, "il") &&
      ZeroOrMore(ParseBracedExpression, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] nw <expression>* _ <type> E
  //              ::= [gs] nw <expression>* _ <type> <initializer>
  //              ::= [gs] na <expression>* _ <type> E
  //              ::= [gs] na <expression>* _ <type> <initializer>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "nw") || ParseTwoCharToken(state, "na")) &&
      ZeroOrMore(ParseExpression, state) && ParseOneCharToken(state, '_') &&
      ParseType(state) &&
      (ParseOneCharToken(state, 'E') || ParseInitializer(state))) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= [gs] dl <expression>
  //              ::= [gs] da <expression>
  if (Optional(ParseTwoCharToken(state, "gs")) &&
      (ParseTwoCharToken(state, "dl") || ParseTwoCharToken(state, "da")) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // dynamic_cast, static_cast, const_cast, reinterpret_cast.
  //
  // <expression> ::= (dc | sc | cc | rc) <type> <expression>
  if (ParseCharClass(state, "dscr") && ParseOneCharToken(state, 'c') &&
      ParseType(state) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parse the conversion expressions jointly to avoid re-parsing the <type> in
  // their common prefix.  Parsed as:
  // <expression> ::= cv <type> <conversion-args>
  // <conversion-args> ::= _ <expression>* E
  //                   ::= <expression>
  //
  // Also don't try ParseOperatorName after seeing "cv", since ParseOperatorName
  // also needs to accept "cv <type>" in other contexts.
  if (ParseTwoCharToken(state, "cv")) {
    if (ParseType(state)) {
      ParseState copy2 = state->parse_state;
      if (ParseOneCharToken(state, '_') && ZeroOrMore(ParseExpression, state) &&
          ParseOneCharToken(state, 'E')) {
        return true;
      }
      state->parse_state = copy2;
      if (ParseExpression(state)) {
        return true;
      }
    }
  } else {
    // Parse unary, binary, and ternary operator expressions jointly, taking
    // care not to re-parse subexpressions repeatedly. Parse like:
    //   <expression> ::= <operator-name> <expression>
    //                    [<one-to-two-expressions>]
    //   <one-to-two-expressions> ::= <expression> [<expression>]
    int arity = -1;
    if (ParseOperatorName(state, &arity) &&
        arity > 0 &&  // 0 arity => disabled.
        (arity < 3 || ParseExpression(state)) &&
        (arity < 2 || ParseExpression(state)) &&
        (arity < 1 || ParseExpression(state))) {
      return true;
    }
  }
  state->parse_state = copy;

  // typeid(type)
  if (ParseTwoCharToken(state, "ti") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // typeid(expression)
  if (ParseTwoCharToken(state, "te") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof type
  if (ParseTwoCharToken(state, "st") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(type)
  if (ParseTwoCharToken(state, "at") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // alignof(expression), a GNU extension
  if (ParseTwoCharToken(state, "az") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // noexcept(expression) appearing as an expression in a dependent signature
  if (ParseTwoCharToken(state, "nx") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack)
  //
  // <expression> ::= sZ <template-param>
  //              ::= sZ <function-param>
  if (ParseTwoCharToken(state, "sZ") &&
      (ParseFunctionParam(state) || ParseTemplateParam(state))) {
    return true;
  }
  state->parse_state = copy;

  // sizeof...(pack) captured from an alias template
  //
  // <expression> ::= sP <template-arg>* E
  if (ParseTwoCharToken(state, "sP") && ZeroOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // Unary folds (... op pack) and (pack op ...).
  //
  // <expression> ::= fl <binary operator-name> <expression>
  //              ::= fr <binary operator-name> <expression>
  if ((ParseTwoCharToken(state, "fl") || ParseTwoCharToken(state, "fr")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Binary folds (init op ... op pack) and (pack op ... op init).
  //
  // <expression> ::= fL <binary operator-name> <expression> <expression>
  //              ::= fR <binary operator-name> <expression> <expression>
  if ((ParseTwoCharToken(state, "fL") || ParseTwoCharToken(state, "fR")) &&
      ParseOperatorName(state, nullptr) && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tw <expression>: throw e
  if (ParseTwoCharToken(state, "tw") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // tr: throw (rethrows an exception from the handler that caught it)
  if (ParseTwoCharToken(state, "tr")) return true;

  // Object and pointer member access expressions.
  //
  // <expression> ::= (dt | pt) <expression> <unresolved-name>
  if ((ParseTwoCharToken(state, "dt") || ParseTwoCharToken(state, "pt")) &&
      ParseExpression(state) && ParseUnresolvedName(state)) {
    return true;
  }
  state->parse_state = copy;

  // Pointer-to-member access expressions.  This parses the same as a binary
  // operator, but it's implemented separately because "ds" shouldn't be
  // accepted in other contexts that parse an operator name.
  if (ParseTwoCharToken(state, "ds") && ParseExpression(state) &&
      ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Parameter pack expansion
  if (ParseTwoCharToken(state, "sp") && ParseExpression(state)) {
    return true;
  }
  state->parse_state = copy;

  // Vendor extended expressions
  if (ParseOneCharToken(state, 'u') && ParseSourceName(state) &&
      ZeroOrMore(ParseTemplateArg, state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rq <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rq") && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  // <expression> ::= rQ <bare-function-type> _ <requirement>+ E
  //
  // https://github.com/itanium-cxx-abi/cxx-abi/issues/24
  if (ParseTwoCharToken(state, "rQ") && ParseBareFunctionType(state) &&
      ParseOneCharToken(state, '_') && OneOrMore(ParseRequirement, state) &&
      ParseOneCharToken(state, 'E')) {
    return true;
  }
  state->parse_state = copy;

  return ParseUnresolvedName(state);
}